

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

string * chaiscript::exception::eval_error::format
                   (string *__return_storage_ptr__,string *t_why,File_Position *t_where,
                   string *t_fname)

{
  File_Position *t_where_00;
  string local_220;
  string local_200;
  string local_1d0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  string *local_28;
  string *t_fname_local;
  File_Position *t_where_local;
  string *t_why_local;
  
  local_28 = t_fname;
  t_fname_local = (string *)t_where;
  t_where_local = (File_Position *)t_why;
  t_why_local = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b0);
  format_why(&local_1d0,(string *)t_where_local);
  std::operator<<(local_1a0,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::operator<<(local_1a0," ");
  format_filename(&local_200,local_28);
  std::operator<<(local_1a0,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::operator<<(local_1a0," ");
  format_location_abi_cxx11_(&local_220,(eval_error *)t_fname_local,t_where_00);
  std::operator<<(local_1a0,(string *)&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

static std::string format(const std::string &t_why, const File_Position &t_where, const std::string &t_fname) {
        std::stringstream ss;

        ss << format_why(t_why);
        ss << " ";

        ss << format_filename(t_fname);
        ss << " ";

        ss << format_location(t_where);

        return ss.str();
      }